

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O1

int dsa_pub_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  int iVar1;
  DSA *r;
  BIGNUM *ret;
  int line;
  
  if (params->len == 0) {
    r = DSA_new();
    if (r != (DSA *)0x0) goto LAB_0016c236;
LAB_0016c27c:
    iVar1 = 0;
  }
  else {
    r = (DSA *)DSA_parse_parameters(params);
    if ((r == (DSA *)0x0) || (params->len != 0)) {
      line = 0x28;
    }
    else {
LAB_0016c236:
      ret = BN_new();
      r->p = ret;
      if (ret == (BIGNUM *)0x0) goto LAB_0016c27c;
      iVar1 = BN_parse_asn1_unsigned(key,(BIGNUM *)ret);
      if ((iVar1 != 0) && (key->len == 0)) {
        evp_pkey_set_method(out,&dsa_asn1_meth);
        out->pkey = r;
        iVar1 = 1;
        r = (DSA *)0x0;
        goto LAB_0016c27e;
      }
      line = 0x33;
    }
    iVar1 = 0;
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                  ,line);
  }
LAB_0016c27e:
  if (r != (DSA *)0x0) {
    DSA_free(r);
  }
  return iVar1;
}

Assistant:

static int dsa_pub_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See RFC 3279, section 2.3.2.

  // Parameters may or may not be present.
  bssl::UniquePtr<DSA> dsa;
  if (CBS_len(params) == 0) {
    dsa.reset(DSA_new());
    if (dsa == nullptr) {
      return 0;
    }
  } else {
    dsa.reset(DSA_parse_parameters(params));
    if (dsa == nullptr || CBS_len(params) != 0) {
      OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
      return 0;
    }
  }

  dsa->pub_key = BN_new();
  if (dsa->pub_key == nullptr) {
    return 0;
  }

  if (!BN_parse_asn1_unsigned(key, dsa->pub_key) || CBS_len(key) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  EVP_PKEY_assign_DSA(out, dsa.release());
  return 1;
}